

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_read_poc_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  uint uVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  opj_event_mgr_t *in_RCX;
  uint in_EDX;
  OPJ_BYTE *in_RSI;
  long in_RDI;
  opj_poc_t *l_current_poc;
  opj_tcp_v2_t *l_tcp;
  opj_cp_v2_t *l_cp;
  OPJ_UINT32 l_comp_room;
  OPJ_UINT32 l_chunk_size;
  OPJ_UINT32 l_current_poc_remaining;
  OPJ_UINT32 l_current_poc_nb;
  OPJ_UINT32 l_old_poc_nb;
  opj_image_t *l_image;
  OPJ_UINT32 l_tmp;
  OPJ_UINT32 l_nb_comp;
  OPJ_UINT32 i;
  uint local_7c;
  long local_78;
  OPJ_UINT32 *local_70;
  uint local_54;
  OPJ_UINT32 local_34;
  uint local_30;
  uint local_2c;
  OPJ_BYTE *local_18;
  opj_bool local_4;
  
  local_30 = *(uint *)(*(long *)(in_RDI + 0x60) + 0x10);
  if (local_30 < 0x101) {
    local_54 = 1;
  }
  else {
    local_54 = 2;
  }
  uVar1 = local_54 * 2 + 5;
  uVar2 = in_EDX / uVar1;
  if ((uVar2 == 0) || (in_EDX % uVar1 != 0)) {
    opj_event_msg_v2(in_RCX,1,"Error reading POC marker\n");
    local_4 = 0;
  }
  else {
    if (*(int *)(in_RDI + 8) == 0x10) {
      local_78 = *(long *)(in_RDI + 0xd0) + (ulong)*(uint *)(in_RDI + 0x118) * 0x1630;
    }
    else {
      local_78 = *(long *)(in_RDI + 0x10);
    }
    if ((*(byte *)(local_78 + 0x1628) >> 1 & 1) == 0) {
      local_7c = 0;
    }
    else {
      local_7c = *(int *)(local_78 + 0x1a4) + 1;
    }
    uVar2 = local_7c + uVar2;
    *(byte *)(local_78 + 0x1628) = *(byte *)(local_78 + 0x1628) & 0xfd | 2;
    local_70 = (OPJ_UINT32 *)(local_78 + 0x1a8 + (ulong)local_7c * 0x94);
    local_18 = in_RSI;
    for (local_2c = local_7c; local_2c < uVar2; local_2c = local_2c + 1) {
      opj_read_bytes_LE(local_18,local_70,1);
      local_18 = local_18 + 1;
      opj_read_bytes_LE(local_18,local_70 + 1,local_54);
      local_18 = local_18 + local_54;
      opj_read_bytes_LE(local_18,local_70 + 2,2);
      local_18 = local_18 + 2;
      opj_read_bytes_LE(local_18,local_70 + 3,1);
      local_18 = local_18 + 1;
      opj_read_bytes_LE(local_18,local_70 + 4,local_54);
      local_18 = local_18 + local_54;
      opj_read_bytes_LE(local_18,&local_34,1);
      local_18 = local_18 + 1;
      local_70[9] = local_34;
      OVar3 = uint_min(local_70[4],local_30);
      local_70[4] = OVar3;
      local_70 = local_70 + 0x25;
    }
    *(uint *)(local_78 + 0x1a4) = uVar2 - 1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

opj_bool j2k_read_poc_v2 (
						opj_j2k_v2_t *p_j2k,
						OPJ_BYTE * p_header_data,
						OPJ_UINT32 p_header_size,
						struct opj_event_mgr * p_manager)
{
	OPJ_UINT32 i, l_nb_comp, l_tmp;
	opj_image_t * l_image = 00;
	OPJ_UINT32 l_old_poc_nb, l_current_poc_nb, l_current_poc_remaining;
	OPJ_UINT32 l_chunk_size, l_comp_room;

	opj_cp_v2_t *l_cp = 00;
	opj_tcp_v2_t *l_tcp = 00;
	opj_poc_t *l_current_poc = 00;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	l_image = p_j2k->m_private_image;
	l_nb_comp = l_image->numcomps;
	if (l_nb_comp <= 256) {
		l_comp_room = 1;
	}
	else {
		l_comp_room = 2;
	}
	l_chunk_size = 5 + 2 * l_comp_room;
	l_current_poc_nb = p_header_size / l_chunk_size;
	l_current_poc_remaining = p_header_size % l_chunk_size;

	if ((l_current_poc_nb <= 0) || (l_current_poc_remaining != 0)) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading POC marker\n");
		return OPJ_FALSE;
	}

	l_cp = &(p_j2k->m_cp);
	l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH) ?
				&l_cp->tcps[p_j2k->m_current_tile_number] :
				p_j2k->m_specific_param.m_decoder.m_default_tcp;
	l_old_poc_nb = l_tcp->POC ? l_tcp->numpocs + 1 : 0;
	l_current_poc_nb += l_old_poc_nb;

	assert(l_current_poc_nb < 32);

	/* now poc is in use.*/
	l_tcp->POC = 1;

	l_current_poc = &l_tcp->pocs[l_old_poc_nb];
	for	(i = l_old_poc_nb; i < l_current_poc_nb; ++i) {
		opj_read_bytes(p_header_data,&(l_current_poc->resno0),1);				/* RSpoc_i */
		++p_header_data;
		opj_read_bytes(p_header_data,&(l_current_poc->compno0),l_comp_room);	/* CSpoc_i */
		p_header_data+=l_comp_room;
		opj_read_bytes(p_header_data,&(l_current_poc->layno1),2);				/* LYEpoc_i */
		p_header_data+=2;
		opj_read_bytes(p_header_data,&(l_current_poc->resno1),1);				/* REpoc_i */
		++p_header_data;
		opj_read_bytes(p_header_data,&(l_current_poc->compno1),l_comp_room);	/* CEpoc_i */
		p_header_data+=l_comp_room;
		opj_read_bytes(p_header_data,&l_tmp,1);									/* Ppoc_i */
		++p_header_data;
		l_current_poc->prg = (OPJ_PROG_ORDER) l_tmp;
		/* make sure comp is in acceptable bounds */
		l_current_poc->compno1 = uint_min(l_current_poc->compno1, l_nb_comp);
		++l_current_poc;
	}

	l_tcp->numpocs = l_current_poc_nb - 1;
	return OPJ_TRUE;
}